

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void * __thiscall google::protobuf::DynamicMessage::MutableRaw(DynamicMessage *this,int i)

{
  uint v;
  Type type;
  int offset;
  type puVar1;
  FieldDescriptor *this_00;
  void *pvVar2;
  int i_local;
  DynamicMessage *this_local;
  
  puVar1 = std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::operator[]
                     (&this->type_info_->offsets,(long)i);
  v = *puVar1;
  this_00 = Descriptor::field(this->type_info_->type,i);
  type = FieldDescriptor::type(this_00);
  offset = OffsetValue(this,v,type);
  pvVar2 = OffsetToPointer(this,offset);
  return pvVar2;
}

Assistant:

inline void* DynamicMessage::MutableRaw(int i) {
  return OffsetToPointer(
      OffsetValue(type_info_->offsets[i], type_info_->type->field(i)->type()));
}